

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void deqp::egl::Image::framebufferRenderbuffer(Functions *gl,GLenum attachment,GLuint rbo)

{
  GLenum GVar1;
  deBool dVar2;
  NotSupportedError *this;
  char *pcVar3;
  allocator<char> local_85 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  GLuint local_18;
  GLenum local_14;
  GLuint rbo_local;
  GLenum attachment_local;
  Functions *gl_local;
  
  local_18 = rbo;
  local_14 = attachment;
  _rbo_local = gl;
  do {
    (*_rbo_local->framebufferRenderbuffer)(0x8d40,local_14,0x8d41,local_18);
    GVar1 = (*_rbo_local->getError)();
    glu::checkError(GVar1,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x167);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (GVar1 = (*_rbo_local->checkFramebufferStatus)(0x8d40), GVar1 == 0x8cd5))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar3 = glu::getFramebufferAttachmentName(local_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar3,local_85);
  std::operator+(&local_58,"EGLImage as ",&local_78);
  std::operator+(&local_38,&local_58," not supported");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this,pcVar3,"gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x16a);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

static void framebufferRenderbuffer (const glw::Functions& gl, GLenum attachment, GLuint rbo)
{
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo));
	TCU_CHECK_AND_THROW(NotSupportedError,
						gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE,
						("EGLImage as " + string(glu::getFramebufferAttachmentName(attachment)) + " not supported").c_str());
}